

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O3

decNumber_conflict * decNumberFromInt64(decNumber_conflict *dn,int64_t in)

{
  uint64_t uin;
  
  uin = -in;
  if (0 < in) {
    uin = in;
  }
  decNumberFromUInt64(dn,uin);
  if (in < 0) {
    dn->bits = 0x80;
  }
  return dn;
}

Assistant:

decNumber *decNumberFromInt64(decNumber *dn, int64_t in)
{
    uint64_t unsig = in;
    if (in < 0) {
#ifdef _MSC_VER
        unsig = 0 - unsig;
#else
        unsig = -unsig;
#endif
    }

    decNumberFromUInt64(dn, unsig);
    if (in < 0) {
        dn->bits = DECNEG;        /* sign needed */
    }
    return dn;
}